

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcc_string.c
# Opt level: O3

char gstr_cmp(char *a,char *b)

{
  char cVar1;
  char cVar2;
  long lVar3;
  
  cVar1 = *a;
  cVar2 = *b;
  if (cVar1 != '\0' && cVar1 == cVar2) {
    lVar3 = 1;
    do {
      cVar1 = a[lVar3];
      cVar2 = b[lVar3];
      if (cVar1 == '\0') break;
      lVar3 = lVar3 + 1;
    } while (cVar1 == cVar2);
  }
  return cVar1 == cVar2;
}

Assistant:

char gstr_cmp(const char *a,const char *b)
{
	while(*a==*b && *a)
		++a,++b;
	if(*a==*b)
		return 1;
	else
		return 0;
}